

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O2

Ray * __thiscall
phyr::Transform::operator()
          (Ray *__return_storage_ptr__,Transform *this,Ray *r,Vector3f *roAbsError,
          Vector3f *rdAbsError)

{
  double dVar1;
  double dVar2;
  Vector3f d;
  Point3<double> local_68;
  double local_48;
  double dStack_40;
  double local_38;
  
  operator()(&local_68,this,&r->o,roAbsError);
  operator()(this,&r->d,rdAbsError);
  dVar1 = r->tMax;
  dVar2 = local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40;
  if (0.0 < dVar2) {
    dVar2 = (ABS(local_38) * roAbsError->z +
            ABS(local_48) * roAbsError->x + ABS(dStack_40) * roAbsError->y) / dVar2;
    local_68.x = dVar2 * local_48 + local_68.x;
    local_68.y = dVar2 * dStack_40 + local_68.y;
    local_68.z = local_38 * dVar2 + local_68.z;
  }
  (__return_storage_ptr__->o).z = local_68.z;
  (__return_storage_ptr__->o).x = local_68.x;
  (__return_storage_ptr__->o).y = local_68.y;
  (__return_storage_ptr__->d).x = local_48;
  (__return_storage_ptr__->d).y = dStack_40;
  (__return_storage_ptr__->d).z = local_38;
  __return_storage_ptr__->tMax = dVar1;
  return __return_storage_ptr__;
}

Assistant:

inline Ray Transform::operator()(const Ray& r, Vector3f* roAbsError, Vector3f* rdAbsError) const {
    // Transform ray origin and direction
    Point3f o = (*this)(r.o, roAbsError);
    Vector3f d = (*this)(r.d, rdAbsError);

    Real tMax = r.tMax, lengthSq = d.lengthSquared();
    if (lengthSq > 0) {
        Real factor = dot(abs(d), *roAbsError) / lengthSq;
        o += d * factor; // tMax -= factor;
    }

    return Ray(o, d, tMax);
}